

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-id.c++
# Opt level: O1

ArrayPtr<const_unsigned_char> __thiscall
capnp::compiler::TypeIdGenerator::finish(TypeIdGenerator *this)

{
  byte *ptr;
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ArrayPtr<const_unsigned_char> AVar5;
  
  if (this->finished == false) {
    uVar4 = (ulong)((this->ctx).lo & 0x3f);
    ptr = (this->ctx).buffer;
    lVar3 = uVar4 + 1;
    (this->ctx).buffer[uVar4] = 0x80;
    uVar4 = uVar4 ^ 0x3f;
    if (uVar4 < 8) {
      memset(ptr + lVar3,0,uVar4);
      uVar4 = 0x40;
      body(this,ptr,0x40);
      lVar3 = 0;
    }
    memset(ptr + lVar3,0,uVar4 - 8);
    uVar1 = (this->ctx).lo;
    uVar2 = (this->ctx).hi;
    (this->ctx).lo = uVar1 * 8;
    (this->ctx).buffer[0x38] = (byte)(uVar1 * 8);
    (this->ctx).buffer[0x39] = (byte)(uVar1 >> 5);
    (this->ctx).buffer[0x3a] = (byte)(uVar1 >> 0xd);
    (this->ctx).buffer[0x3b] = (byte)(uVar1 >> 0x15);
    *(uint *)((this->ctx).buffer + 0x3c) = uVar2;
    body(this,ptr,0x40);
    *(undefined8 *)(this->ctx).buffer = *(undefined8 *)&(this->ctx).a;
    *(undefined8 *)((this->ctx).buffer + 8) = *(undefined8 *)&(this->ctx).c;
    this->finished = true;
  }
  AVar5.size_ = 0x10;
  AVar5.ptr = (this->ctx).buffer;
  return AVar5;
}

Assistant:

kj::ArrayPtr<const kj::byte> TypeIdGenerator::finish()
{
  if (!finished) {
    unsigned long used, free;

    used = ctx.lo & 0x3f;

    ctx.buffer[used++] = 0x80;

    free = 64 - used;

    if (free < 8) {
      memset(&ctx.buffer[used], 0, free);
      body(ctx.buffer, 64);
      used = 0;
      free = 64;
    }

    memset(&ctx.buffer[used], 0, free - 8);

    ctx.lo <<= 3;
    ctx.buffer[56] = ctx.lo;
    ctx.buffer[57] = ctx.lo >> 8;
    ctx.buffer[58] = ctx.lo >> 16;
    ctx.buffer[59] = ctx.lo >> 24;
    ctx.buffer[60] = ctx.hi;
    ctx.buffer[61] = ctx.hi >> 8;
    ctx.buffer[62] = ctx.hi >> 16;
    ctx.buffer[63] = ctx.hi >> 24;

    body(ctx.buffer, 64);

    // Store final result into ctx.buffer.
    ctx.buffer[0] = ctx.a;
    ctx.buffer[1] = ctx.a >> 8;
    ctx.buffer[2] = ctx.a >> 16;
    ctx.buffer[3] = ctx.a >> 24;
    ctx.buffer[4] = ctx.b;
    ctx.buffer[5] = ctx.b >> 8;
    ctx.buffer[6] = ctx.b >> 16;
    ctx.buffer[7] = ctx.b >> 24;
    ctx.buffer[8] = ctx.c;
    ctx.buffer[9] = ctx.c >> 8;
    ctx.buffer[10] = ctx.c >> 16;
    ctx.buffer[11] = ctx.c >> 24;
    ctx.buffer[12] = ctx.d;
    ctx.buffer[13] = ctx.d >> 8;
    ctx.buffer[14] = ctx.d >> 16;
    ctx.buffer[15] = ctx.d >> 24;

    finished = true;
  }

  return kj::arrayPtr(ctx.buffer, 16);
}